

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  int iVar1;
  
  if (((l->tt_ & 0xf) == 3) && ((r->tt_ & 0xf) == 3)) {
    iVar1 = LEnum(l,r);
    return iVar1;
  }
  if (((l->tt_ & 0xf) == 4) && ((r->tt_ & 0xf) == 4)) {
    iVar1 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
    return (int)(iVar1 < 1);
  }
  iVar1 = luaT_callorderTM(L,l,r,TM_LE);
  return iVar1;
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LEnum(l, r);
  else return lessequalothers(L, l, r);
}